

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Reader * __thiscall
capnp::DynamicList::Reader::operator[](Reader *__return_storage_ptr__,Reader *this,uint index)

{
  double dVar1;
  byte bVar2;
  undefined2 uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  byte *pbVar7;
  CapTableReader *pCVar8;
  undefined8 uVar9;
  ElementSize expectedElementSize;
  Which WVar10;
  StructSchema SVar11;
  ulong uVar12;
  EnumSchema EVar13;
  InterfaceSchema IVar14;
  Type TVar15;
  ArrayPtr<const_unsigned_char> AVar16;
  uint index_local;
  DebugComparison<unsigned_int_&,_unsigned_int> _kjCondition;
  undefined1 local_b0 [16];
  Fault f;
  StructReader local_88;
  ListReader local_58;
  
  _kjCondition.left = &index_local;
  uVar4 = (this->reader).elementCount;
  _kjCondition.right = uVar4;
  _kjCondition.op.content.ptr = anon_var_dwarf_b832;
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = index < uVar4;
  index_local = index;
  if (uVar4 <= index) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[26]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x412,FAILED,"index < size()","_kjCondition,\"List index out-of-bounds.\"",
               &_kjCondition,(char (*) [26])"List index out-of-bounds.");
    kj::_::Debug::Fault::fatal(&f);
  }
  WVar10 = LIST;
  if ((this->schema).elementType.listDepth == '\0') {
    WVar10 = (this->schema).elementType.baseType;
  }
  switch(WVar10) {
  case VOID:
    __return_storage_ptr__->type = VOID;
    break;
  case BOOL:
    bVar2 = (this->reader).ptr[index >> 3];
    __return_storage_ptr__->type = BOOL;
    (__return_storage_ptr__->field_1).boolValue = (bVar2 >> (index & 7) & 1) != 0;
    break;
  case INT8:
    uVar12 = (ulong)(char)(this->reader).ptr[(ulong)(this->reader).step * (ulong)index >> 3];
    goto LAB_0022757b;
  case INT16:
    uVar12 = (ulong)*(short *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3)
                              );
    goto LAB_0022757b;
  case INT32:
    uVar12 = (ulong)*(int *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
    goto LAB_0022757b;
  case INT64:
    uVar12 = *(ulong *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
LAB_0022757b:
    __return_storage_ptr__->type = INT;
LAB_00227665:
    (__return_storage_ptr__->field_1).intValue = uVar12;
    break;
  case UINT8:
    uVar12 = (ulong)(this->reader).ptr[(ulong)(this->reader).step * (ulong)index >> 3];
    goto LAB_0022765f;
  case UINT16:
    uVar12 = (ulong)*(ushort *)
                     ((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
    goto LAB_0022765f;
  case UINT32:
    uVar12 = (ulong)*(uint *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3))
    ;
    goto LAB_0022765f;
  case UINT64:
    uVar12 = *(ulong *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
LAB_0022765f:
    __return_storage_ptr__->type = UINT;
    goto LAB_00227665;
  case FLOAT32:
    dVar1 = (double)*(float *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3)
                              );
    goto LAB_0022763d;
  case FLOAT64:
    dVar1 = *(double *)((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index >> 3));
LAB_0022763d:
    __return_storage_ptr__->type = FLOAT;
    (__return_storage_ptr__->field_1).intValue = (int64_t)dVar1;
    break;
  case TEXT:
    _kjCondition.op.content.ptr =
         (char *)((this->reader).ptr +
                 ((ulong)(this->reader).step * (ulong)index >> 3) +
                 (ulong)((this->reader).structDataSize >> 3));
    _kjCondition.left = (uint *)(this->reader).segment;
    _kjCondition._8_8_ = (this->reader).capTable;
    _kjCondition.op.content.size_ = (size_t)(uint)(this->reader).nestingLimit;
    AVar16 = (ArrayPtr<const_unsigned_char>)
             capnp::_::PointerReader::getBlob<capnp::Text>
                       ((PointerReader *)&_kjCondition,(void *)0x0,0);
    __return_storage_ptr__->type = TEXT;
    goto LAB_002275c9;
  case DATA:
    _kjCondition.op.content.ptr =
         (char *)((this->reader).ptr +
                 ((ulong)(this->reader).step * (ulong)index >> 3) +
                 (ulong)((this->reader).structDataSize >> 3));
    _kjCondition.left = (uint *)(this->reader).segment;
    _kjCondition._8_8_ = (this->reader).capTable;
    _kjCondition.op.content.size_ = (size_t)(uint)(this->reader).nestingLimit;
    AVar16 = (ArrayPtr<const_unsigned_char>)
             capnp::_::PointerReader::getBlob<capnp::Data>
                       ((PointerReader *)&_kjCondition,(void *)0x0,0);
    __return_storage_ptr__->type = DATA;
LAB_002275c9:
    (__return_storage_ptr__->field_1).dataValue.super_ArrayPtr<const_unsigned_char> = AVar16;
    break;
  case LIST:
    TVar15 = (Type)Type::asList((Type *)this);
    _kjCondition.op.content.ptr =
         (char *)((this->reader).ptr +
                 ((ulong)(this->reader).step * (ulong)index_local >> 3) +
                 (ulong)((this->reader).structDataSize >> 3));
    _kjCondition.left = (uint *)(this->reader).segment;
    _kjCondition._8_8_ = (this->reader).capTable;
    _kjCondition.op.content.size_ =
         CONCAT44(_kjCondition.op.content.size_._4_4_,(this->reader).nestingLimit);
    WVar10 = LIST;
    if (((undefined1  [16])TVar15 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
      WVar10 = TVar15.baseType;
    }
    expectedElementSize = anon_unknown_71::elementSizeFor(WVar10);
    capnp::_::PointerReader::getList
              (&local_58,(PointerReader *)&_kjCondition,expectedElementSize,(word *)0x0);
    *(StructDataBitCount *)((long)&__return_storage_ptr__->field_1 + 0x30) = local_58.structDataSize
    ;
    *(StructPointerCount *)((long)&__return_storage_ptr__->field_1 + 0x34) =
         local_58.structPointerCount;
    *(ElementSize *)((long)&__return_storage_ptr__->field_1 + 0x36) = local_58.elementSize;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = local_58._39_1_;
    *(int *)((long)&__return_storage_ptr__->field_1 + 0x38) = local_58.nestingLimit;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x3c) = local_58._44_4_;
    (__return_storage_ptr__->field_1).listValue.reader.ptr = local_58.ptr;
    *(ListElementCount *)((long)&__return_storage_ptr__->field_1 + 0x28) = local_58.elementCount;
    *(BitsPerElementN<23> *)((long)&__return_storage_ptr__->field_1 + 0x2c) = local_58.step;
    (__return_storage_ptr__->field_1).listValue.reader.segment = local_58.segment;
    (__return_storage_ptr__->field_1).listValue.reader.capTable = local_58.capTable;
    __return_storage_ptr__->type = LIST;
    (__return_storage_ptr__->field_1).listValue.schema.elementType = TVar15;
    break;
  case ENUM:
    EVar13 = Type::asEnum((Type *)this);
    uVar3 = *(undefined2 *)
             ((this->reader).ptr + ((ulong)(this->reader).step * (ulong)index_local >> 3));
    __return_storage_ptr__->type = ENUM;
    (__return_storage_ptr__->field_1).enumValue.schema.super_Schema.raw =
         (RawBrandedSchema *)EVar13.super_Schema.raw;
    *(undefined2 *)&(__return_storage_ptr__->field_1).listValue.schema.elementType.field_4 = uVar3;
    break;
  case STRUCT:
    SVar11 = Type::asStruct((Type *)this);
    capnp::_::ListReader::getStructElement(&local_88,&this->reader,index_local);
    *(undefined8 *)&(__return_storage_ptr__->field_1).listValue.reader.elementCount =
         local_88._32_8_;
    *(int *)((long)&__return_storage_ptr__->field_1 + 0x30) = local_88.nestingLimit;
    *(undefined2 *)((long)&__return_storage_ptr__->field_1 + 0x34) = local_88._44_2_;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x36) = local_88._46_1_;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = local_88._47_1_;
    (__return_storage_ptr__->field_1).listValue.reader.capTable = (CapTableReader *)local_88.data;
    (__return_storage_ptr__->field_1).listValue.reader.ptr = (byte *)local_88.pointers;
    (__return_storage_ptr__->field_1).textValue.super_StringPtr.content.size_ =
         (size_t)local_88.segment;
    (__return_storage_ptr__->field_1).listValue.reader.segment = (SegmentReader *)local_88.capTable;
    __return_storage_ptr__->type = STRUCT;
    (__return_storage_ptr__->field_1).structValue.schema.super_Schema.raw =
         (RawBrandedSchema *)SVar11.super_Schema.raw;
    break;
  case INTERFACE:
    IVar14 = Type::asInterface((Type *)this);
    _kjCondition.op.content.ptr =
         (char *)((this->reader).ptr +
                 ((ulong)(this->reader).step * (ulong)index_local >> 3) +
                 (ulong)((this->reader).structDataSize >> 3));
    _kjCondition.left = (uint *)(this->reader).segment;
    _kjCondition._8_8_ = (this->reader).capTable;
    _kjCondition.op.content.size_ =
         CONCAT44(_kjCondition.op.content.size_._4_4_,(this->reader).nestingLimit);
    capnp::_::PointerReader::getCapability((PointerReader *)local_b0);
    uVar9 = local_b0._8_8_;
    f.exception = (Exception *)local_b0._0_8_;
    local_b0._8_8_ = (ClientHook *)0x0;
    __return_storage_ptr__->type = CAPABILITY;
    (__return_storage_ptr__->field_1).enumValue.schema.super_Schema.raw =
         (RawBrandedSchema *)local_b0._0_8_;
    (__return_storage_ptr__->field_1).textValue.super_StringPtr.content.size_ = uVar9;
    (__return_storage_ptr__->field_1).capabilityValue.schema.super_Schema.raw =
         (RawBrandedSchema *)IVar14.super_Schema.raw;
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
              ((Own<capnp::ClientHook,_std::nullptr_t> *)&f);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
              ((Own<capnp::ClientHook,_std::nullptr_t> *)local_b0);
    break;
  case ANY_POINTER:
    uVar4 = (this->reader).step;
    uVar5 = (this->reader).structDataSize;
    pbVar7 = (this->reader).ptr;
    iVar6 = (this->reader).nestingLimit;
    __return_storage_ptr__->type = ANY_POINTER;
    pCVar8 = (this->reader).capTable;
    (__return_storage_ptr__->field_1).intValue = (int64_t)(this->reader).segment;
    (__return_storage_ptr__->field_1).textValue.super_StringPtr.content.size_ = (size_t)pCVar8;
    (__return_storage_ptr__->field_1).listValue.reader.segment =
         (SegmentReader *)(pbVar7 + ((ulong)uVar4 * (ulong)index >> 3) + (ulong)(uVar5 >> 3));
    *(int *)((long)&__return_storage_ptr__->field_1 + 0x18) = iVar6;
    break;
  default:
    __return_storage_ptr__->type = UNKNOWN;
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Reader DynamicList::Reader::operator[](uint index) const {
  KJ_REQUIRE(index < size(), "List index out-of-bounds.");

  switch (schema.whichElementType()) {
#define HANDLE_TYPE(name, discrim, typeName) \
    case schema::Type::discrim: \
      return reader.getDataElement<typeName>(bounded(index) * ELEMENTS);

    HANDLE_TYPE(void, VOID, Void)
    HANDLE_TYPE(bool, BOOL, bool)
    HANDLE_TYPE(int8, INT8, int8_t)
    HANDLE_TYPE(int16, INT16, int16_t)
    HANDLE_TYPE(int32, INT32, int32_t)
    HANDLE_TYPE(int64, INT64, int64_t)
    HANDLE_TYPE(uint8, UINT8, uint8_t)
    HANDLE_TYPE(uint16, UINT16, uint16_t)
    HANDLE_TYPE(uint32, UINT32, uint32_t)
    HANDLE_TYPE(uint64, UINT64, uint64_t)
    HANDLE_TYPE(float32, FLOAT32, float)
    HANDLE_TYPE(float64, FLOAT64, double)
#undef HANDLE_TYPE

    case schema::Type::TEXT:
      return reader.getPointerElement(bounded(index) * ELEMENTS)
                   .getBlob<Text>(nullptr, ZERO * BYTES);
    case schema::Type::DATA:
      return reader.getPointerElement(bounded(index) * ELEMENTS)
                   .getBlob<Data>(nullptr, ZERO * BYTES);

    case schema::Type::LIST: {
      auto elementType = schema.getListElementType();
      return DynamicList::Reader(elementType,
          reader.getPointerElement(bounded(index) * ELEMENTS)
                .getList(elementSizeFor(elementType.whichElementType()), nullptr));
    }

    case schema::Type::STRUCT:
      return DynamicStruct::Reader(schema.getStructElementType(),
                                   reader.getStructElement(bounded(index) * ELEMENTS));

    case schema::Type::ENUM:
      return DynamicEnum(schema.getEnumElementType(),
                         reader.getDataElement<uint16_t>(bounded(index) * ELEMENTS));

    case schema::Type::ANY_POINTER:
      return AnyPointer::Reader(reader.getPointerElement(bounded(index) * ELEMENTS));

    case schema::Type::INTERFACE:
      return DynamicCapability::Client(schema.getInterfaceElementType(),
                                       reader.getPointerElement(bounded(index) * ELEMENTS)
                                             .getCapability());
  }

  return nullptr;
}